

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.c
# Opt level: O0

void mafilter2(double *sig,int N,int window,double *oup)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double local_40;
  double sum;
  int local_30;
  int j;
  int i;
  int N2;
  int q;
  int odd;
  double *oup_local;
  int window_local;
  int N_local;
  double *sig_local;
  
  if (window % 2 == 0) {
    iVar2 = window / 2;
    for (local_30 = 0; iVar1 = iVar2, local_30 < iVar2; local_30 = local_30 + 1) {
      oup[local_30] = sig[local_30];
    }
    while (local_30 = iVar1, local_30 < N - iVar2) {
      local_40 = 0.0;
      for (sum._4_4_ = local_30 - iVar2; sum._4_4_ < local_30 + iVar2 + 1; sum._4_4_ = sum._4_4_ + 1
          ) {
        if ((sum._4_4_ == local_30 - iVar2) || (sum._4_4_ == local_30 + iVar2)) {
          dVar3 = sig[sum._4_4_] * 0.5;
        }
        else {
          dVar3 = sig[sum._4_4_];
        }
        local_40 = dVar3 + local_40;
      }
      oup[local_30] = local_40 / (double)window;
      iVar1 = local_30 + 1;
    }
    for (local_30 = N - iVar2; local_30 < N; local_30 = local_30 + 1) {
      oup[local_30] = sig[local_30];
    }
  }
  else {
    iVar2 = (window + -1) / 2;
    for (local_30 = 0; iVar1 = iVar2, local_30 < iVar2; local_30 = local_30 + 1) {
      oup[local_30] = sig[local_30];
    }
    while (local_30 = iVar1, local_30 < N - iVar2) {
      local_40 = 0.0;
      for (sum._4_4_ = local_30 - iVar2; sum._4_4_ < local_30 + iVar2 + 1; sum._4_4_ = sum._4_4_ + 1
          ) {
        local_40 = sig[sum._4_4_] + local_40;
      }
      oup[local_30] = local_40 / (double)window;
      iVar1 = local_30 + 1;
    }
    for (local_30 = N - iVar2; local_30 < N; local_30 = local_30 + 1) {
      oup[local_30] = sig[local_30];
    }
  }
  return;
}

Assistant:

void mafilter2(double *sig,int N, int window,double *oup) {
	int odd,q,N2,i,j;
	double sum;
	/*
	 * mafilter2 is a smoothing filter that smoothes a signal by using
	 * a window. No signal extension is done in this case. Instead,
	 * first floor(window/2) signal terms and last [window - floor(window/2)]
	 * terms are left untouched. The smoothing is performed over the rest
	 * of the terms.
	 *
	 */
	
	odd = window - ((window/2) * 2);
	
	if (odd) {
		q = (window - 1 ) / 2; 
	} else {
		q = window / 2;
	}
	
	if (odd) {
		for (i = 0; i < q; i++) {
			oup[i] = sig[i];
		}
		for (i = q; i < N-q; ++i) {
			sum = 0.0;
			for (j = i - q; j < i + q + 1;j++) {
				sum += sig[j];
			}
			oup[i] = sum /window;
		}  
		for (i = N-q; i < N; i++) {
			oup[i] = sig[i];
		}
	} else {
		for (i = 0; i < q; i++) {
			oup[i] = sig[i];
		}
		for (i = q; i < N-q; ++i) {
			sum = 0.0;
			for (j = i - q; j < i + q + 1;j++) {
				if ( j == i - q || j == i + q) {
					sum += 0.5 * sig[j];
				} else {
					sum += sig[j];
				}
			}
			oup[i] = sum /window;
		}  
		for (i = N-q; i < N; i++) {
			oup[i] = sig[i];
		}
	}
}